

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCapsuleShape.cpp
# Opt level: O1

void __thiscall chrono::ChCapsuleShape::ArchiveIN(ChCapsuleShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChCapsule> specFuncA;
  undefined **local_38;
  ChCapsule *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChCapsuleShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->gcapsule;
  local_38 = &PTR__ChFunctorArchiveIn_00b69040;
  local_28 = "gcapsule";
  local_18 = 0;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChCapsuleShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChCapsuleShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gcapsule);
}